

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall TPZAnalysis::OptimizeBandwidth(TPZAnalysis *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  TPZCompEl *pTVar3;
  TPZRenumbering *pTVar4;
  int64_t iVar5;
  TPZCompEl **ppTVar6;
  long lVar7;
  long nelem;
  TPZVec<long> perm;
  set<long,_std::less<long>,_std::allocator<long>_> depconlist;
  TPZVec<long> iperm;
  TPZStack<long,_10> elgraphindex;
  TPZStack<long,_10> elgraph;
  set<long,_std::less<long>,_std::allocator<long>_> indepconlist;
  
  if (this->fCompMesh != (TPZCompMesh *)0x0) {
    perm._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
    perm.fStore = (long *)0x0;
    perm.fNElements = 0;
    perm.fNAlloc = 0;
    iperm._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
    iperm.fStore = (long *)0x0;
    iperm.fNElements = 0;
    iperm.fNAlloc = 0;
    TPZStack<long,_10>::TPZStack(&elgraph);
    TPZStack<long,_10>::TPZStack(&elgraphindex);
    iVar5 = TPZCompMesh::NIndependentConnects(this->fCompMesh);
    if (iVar5 != 0) {
      TPZCompMesh::ComputeElGraph(this->fCompMesh,&elgraph,(TPZVec<long> *)&elgraphindex);
      lVar7 = (this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      p_Var2 = &indepconlist._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = &depconlist._M_t._M_impl.super__Rb_tree_header;
      nelem = 0;
      if (lVar7 < 1) {
        lVar7 = nelem;
      }
      for (; lVar7 != nelem; nelem = nelem + 1) {
        ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&(this->fCompMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                             nelem);
        pTVar3 = *ppTVar6;
        if (pTVar3 != (TPZCompEl *)0x0) {
          indepconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          indepconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          indepconlist._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          depconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          depconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          depconlist._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          depconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          depconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          indepconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          indepconlist._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          (**(code **)(*(long *)pTVar3 + 0x1d8))(pTVar3,&indepconlist._M_t,&depconlist._M_t);
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&depconlist._M_t);
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&indepconlist._M_t);
        }
      }
      pTVar4 = ((this->fRenumber).fRef)->fPointer;
      pTVar4->fNElements =
           elgraphindex.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements + -1;
      pTVar4->fNNodes = iVar5;
      TPZRenumbering::SetElementGraph(pTVar4,(TPZVec<long> *)&elgraph,(TPZVec<long> *)&elgraphindex)
      ;
      pTVar4 = ((this->fRenumber).fRef)->fPointer;
      (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[10])(pTVar4,&perm,&iperm);
      TPZCompMesh::Permute(this->fCompMesh,&perm);
      if (0x186a1 < elgraphindex.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements) {
        std::operator<<((ostream *)&std::cout,"Applying Saddle Permute\n");
      }
      TPZCompMesh::SaddlePermute(this->fCompMesh);
    }
    TPZManVector<long,_10>::~TPZManVector(&elgraphindex.super_TPZManVector<long,_10>);
    TPZManVector<long,_10>::~TPZManVector(&elgraph.super_TPZManVector<long,_10>);
    TPZVec<long>::~TPZVec(&iperm);
    TPZVec<long>::~TPZVec(&perm);
  }
  return;
}

Assistant:

void TPZAnalysis::OptimizeBandwidth() {
	//enquanto nao compilamos o BOOST no windows, vai o sloan antigo
#ifdef WIN32
	if(!fCompMesh) return;
//    fCompMesh->InitializeBlock();
	TPZVec<int64_t> perm,iperm;
	
	TPZStack<int64_t> elgraph;
	TPZStack<int64_t> elgraphindex;
	int64_t nindep = fCompMesh->NIndependentConnects();
	fCompMesh->ComputeElGraph(elgraph,elgraphindex);
	int64_t nel = elgraphindex.NElements()-1;
	TPZSloan sloan(nel,nindep);
	sloan.SetElementGraph(elgraph,elgraphindex);
	sloan.Resequence(perm,iperm);
	fCompMesh->Permute(perm);
#else
	if(!fCompMesh) return;
//    fCompMesh->InitializeBlock();
	
	TPZVec<int64_t> perm,iperm;
	
	TPZStack<int64_t> elgraph,elgraphindex;
	int64_t nindep = fCompMesh->NIndependentConnects();
    
    /// if there are no connects, there is no bandwidth to be optimized
    if(nindep == 0) return;
    
	fCompMesh->ComputeElGraph(elgraph,elgraphindex);
	int64_t nel = elgraphindex.NElements()-1;
	int64_t el,ncel = fCompMesh->NElements();
	int maxelcon = 0;
	for(el = 0; el<ncel; el++)
	{
		TPZCompEl *cel = fCompMesh->ElementVec()[el];
		if(!cel) continue;
		std::set<int64_t> indepconlist,depconlist;
		cel->BuildConnectList(indepconlist,depconlist);
		int64_t locnindep = indepconlist.size();
		maxelcon = maxelcon < locnindep ? locnindep : maxelcon;
	}
	fRenumber->SetElementsNodes(nel,nindep);
	fRenumber->SetElementGraph(elgraph,elgraphindex);
#ifdef PZ_LOG2
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        fRenumber->Print(elgraph, elgraphindex, "Elgraph of submesh", sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    bool shouldstop = false;
    try {
        fRenumber->Resequence(perm,iperm);
    } catch(...)
    {
        fRenumber->PlotElementGroups("ElementGroups.vtk", fCompMesh);
        std::ofstream out("fElementGroups.txt");
        fCompMesh->Print(out);
        shouldstop = true;
    }
    if(shouldstop) DebugStop();
    
	fCompMesh->Permute(perm);
    if (nel > 100000) {
        std::cout << "Applying Saddle Permute\n";
    }
    fCompMesh->SaddlePermute();
//    fCompMesh->SaddlePermute2();
	
#endif
	
}